

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Slow(CodedInputStream *this,uint32 *value)

{
  bool bVar1;
  undefined4 local_28 [2];
  uint64 result;
  uint32 *value_local;
  CodedInputStream *this_local;
  
  result = (uint64)value;
  value_local = (uint32 *)this;
  bVar1 = ReadVarint64Fallback(this,(uint64 *)local_28);
  if (bVar1) {
    *(undefined4 *)result = local_28[0];
  }
  return bVar1;
}

Assistant:

bool CodedInputStream::ReadVarint32Slow(uint32* value) {
  uint64 result;
  // Directly invoke ReadVarint64Fallback, since we already tried to optimize
  // for one-byte varints.
  if (!ReadVarint64Fallback(&result)) return false;
  *value = (uint32)result;
  return true;
}